

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.h
# Opt level: O2

void __thiscall icu_63::number::impl::ParsedPatternInfo::ParsedPatternInfo(ParsedPatternInfo *this)

{
  (this->super_AffixPatternProvider)._vptr_AffixPatternProvider =
       (_func_int **)&PTR__ParsedPatternInfo_003a7000;
  (this->pattern).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b0268;
  (this->pattern).fUnion.fStackFields.fLengthAndFlags = 2;
  ParsedSubpatternInfo::ParsedSubpatternInfo(&this->positive);
  ParsedSubpatternInfo::ParsedSubpatternInfo(&this->negative);
  (this->state).pattern = &this->pattern;
  (this->state).offset = 0;
  this->currentSubpattern = (ParsedSubpatternInfo *)0x0;
  this->fHasNegativeSubpattern = false;
  return;
}

Assistant:

~ParsedPatternInfo() U_OVERRIDE = default;